

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

uint8_t __thiscall CPU::DEC(CPU *this,uint8_t argument)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = argument + 0xff;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010ea4b;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010ea4b:
  this->field_0x2e = bVar2;
  return uVar1;
}

Assistant:

uint8_t CPU::DEC(uint8_t argument) {
	argument--;
	if (argument == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (argument & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
	return argument;
}